

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::ReadObjectUserData(ON_BinaryArchive *this,ON_Object *object)

{
  ON_UUID *uuid;
  _func_int **pp_Var1;
  ON_UUID uuid_00;
  ON_UUID uuid_01;
  ON_UUID item_id;
  ON_UUID application_id;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ON_ClassId *this_00;
  ON_Object *p;
  ON_UserData *this_01;
  ON_UUID *pOVar6;
  ON_UnknownUserData *pOVar7;
  char *sFormat;
  long lVar8;
  byte bVar9;
  ON_Xform *pOVar10;
  ON_Xform *pOVar11;
  byte bVar12;
  uchar in_stack_fffffffffffffeb8 [8];
  bool bChunkReadSuccess;
  ON__UINT32 t;
  int major_userdata_version;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK;
  int minor_userdata_version;
  ON_Object *local_120;
  CUserDataHeaderInfo ud_header;
  ON_ReadChunkHelper ch;
  
  bVar12 = 0;
  bChunkReadSuccess = true;
  bVar9 = 1;
  local_120 = object;
  do {
    if ((bVar9 == 0) || ((bChunkReadSuccess & 1U) == 0)) break;
    ON_ReadChunkHelper::ON_ReadChunkHelper(&ch,this,&bChunkReadSuccess);
    bVar3 = true;
    if (bChunkReadSuccess == true) {
      if (ch.m_chunk_tcode != 0x80027fff) {
        if (ch.m_chunk_tcode == 0x27ffd) {
          if (ch.m_chunk_value < (long)((ulong)(0x31 < this->m_3dm_version) * 0x10 + 0x18)) {
            bVar3 = false;
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                       ,0x15b3,"","TCODE_OPENNURBS_CLASS_USERDATA chunk is too short");
          }
          else {
            major_userdata_version = 0;
            minor_userdata_version = 0;
            bVar3 = Read3dmChunkVersion(this,&major_userdata_version,&minor_userdata_version);
            if (bVar3) {
              if (major_userdata_version - 3U < 0xfffffffe) {
                bVar9 = 1;
                goto LAB_003ca3fc;
              }
              CUserDataHeaderInfo::CUserDataHeaderInfo(&ud_header);
              iVar2 = minor_userdata_version;
              iVar5 = major_userdata_version;
              t = 0;
              length_TCODE_ANONYMOUS_CHUNK = 0;
              memset(&ud_header,0,0xc0);
              if (iVar5 == 2) {
                bVar3 = BeginRead3dmBigChunk(this,&t,&length_TCODE_ANONYMOUS_CHUNK);
                if (bVar3) {
                  if (t == 0x2fff9) goto LAB_003ca48b;
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                             ,0x1544,"",
                             "version 2.0 TCODE_OPENNURBS_CLASS_USERDATA chunk is missing TCODE_OPENNURBS_CLASS_USERDATA_HEADER chunk."
                            );
                  EndRead3dmChunk(this);
                }
              }
              else {
LAB_003ca48b:
                bVar3 = ReadUuid(this,&ud_header.m_classid);
                if (((bVar3) && (bVar3 = ReadUuid(this,&ud_header.m_itemid), bVar3)) &&
                   (bVar3 = ReadInt(this,&ud_header.m_copycount), bVar3)) {
                  bVar3 = ReadXform(this,&ud_header.m_xform);
                }
                else {
                  bVar3 = false;
                }
                if (iVar5 == 2) {
                  if (0 < iVar2) {
                    if (bVar3 == false) {
                      bVar3 = false;
                    }
                    else {
                      bVar3 = ReadUuid(this,&ud_header.m_appid);
                    }
                    if (iVar2 != 1) {
                      if (bVar3 != false) {
                        bVar3 = ReadBool(this,&ud_header.m_bLastSavedAsGoo);
                      }
                      if (bVar3 != false) {
                        bVar3 = ReadInt(this,&ud_header.m_3dm_version);
                      }
                      if (bVar3 != false) {
                        bVar3 = ReadInt(this,&ud_header.m_3dm_opennurbs_version_number);
                      }
                    }
                  }
                  bVar4 = EndRead3dmChunk(this);
                  bVar3 = (bool)(bVar4 & bVar3);
                }
                if (bVar3 != false) {
                  if ((ud_header.m_3dm_version == 0) ||
                     (ud_header.m_3dm_opennurbs_version_number == 0)) {
                    ud_header.m_3dm_version = this->m_3dm_version;
                    if (0x31 < ud_header.m_3dm_version) {
                      ud_header.m_bLastSavedAsGoo = true;
                      ud_header.m_3dm_version = 5;
                    }
                    ud_header.m_3dm_opennurbs_version_number = this->m_3dm_opennurbs_version;
                    if (0xbf9a56d < ud_header.m_3dm_opennurbs_version_number) {
                      ud_header.m_3dm_opennurbs_version_number = 0xbf9a564;
                      ud_header.m_bLastSavedAsGoo = true;
                    }
                  }
                  length_TCODE_ANONYMOUS_CHUNK = 0;
                  t = 0;
                  bVar3 = PeekAt3dmBigChunkType(this,&t,&length_TCODE_ANONYMOUS_CHUNK);
                  if (bVar3) {
                    iVar5 = 0x15d9;
                    sFormat = "Reading object user data - unable to find TCODE_ANONYMOUS_CHUNK";
                    if (t == 0x40008000) {
                      iVar5 = 0x15df;
                      sFormat = "Reading object user data - length of TCODE_ANONYMOUS_CHUNK < 4";
                      if (3 < length_TCODE_ANONYMOUS_CHUNK) {
                        application_id.Data4[0] = ud_header.m_appid.Data4[0];
                        application_id.Data4[1] = ud_header.m_appid.Data4[1];
                        application_id.Data4[2] = ud_header.m_appid.Data4[2];
                        application_id.Data4[3] = ud_header.m_appid.Data4[3];
                        application_id.Data4[4] = ud_header.m_appid.Data4[4];
                        application_id.Data4[5] = ud_header.m_appid.Data4[5];
                        application_id.Data4[6] = ud_header.m_appid.Data4[6];
                        application_id.Data4[7] = ud_header.m_appid.Data4[7];
                        application_id.Data1 = ud_header.m_appid.Data1;
                        application_id.Data2 = ud_header.m_appid.Data2;
                        application_id.Data3 = ud_header.m_appid.Data3;
                        item_id.Data4[0] = ud_header.m_itemid.Data4[0];
                        item_id.Data4[1] = ud_header.m_itemid.Data4[1];
                        item_id.Data4[2] = ud_header.m_itemid.Data4[2];
                        item_id.Data4[3] = ud_header.m_itemid.Data4[3];
                        item_id.Data4[4] = ud_header.m_itemid.Data4[4];
                        item_id.Data4[5] = ud_header.m_itemid.Data4[5];
                        item_id.Data4[6] = ud_header.m_itemid.Data4[6];
                        item_id.Data4[7] = ud_header.m_itemid.Data4[7];
                        item_id.Data1 = ud_header.m_itemid.Data1;
                        item_id.Data2 = ud_header.m_itemid.Data2;
                        item_id.Data3 = ud_header.m_itemid.Data3;
                        bVar3 = ShouldSerializeUserDataItem(this,application_id,item_id);
                        if (bVar3) {
                          uuid_00.Data4[0] = in_stack_fffffffffffffeb8[0];
                          uuid_00.Data4[1] = in_stack_fffffffffffffeb8[1];
                          uuid_00.Data4[2] = in_stack_fffffffffffffeb8[2];
                          uuid_00.Data4[3] = in_stack_fffffffffffffeb8[3];
                          uuid_00.Data4[4] = in_stack_fffffffffffffeb8[4];
                          uuid_00.Data4[5] = in_stack_fffffffffffffeb8[5];
                          uuid_00.Data4[6] = in_stack_fffffffffffffeb8[6];
                          uuid_00.Data4[7] = in_stack_fffffffffffffeb8[7];
                          uuid_00.Data1 = 0x3ca6b2;
                          uuid_00.Data2 = 0;
                          uuid_00.Data3 = 0;
                          this_00 = ON_ClassId::ClassId(uuid_00);
                          if (this_00 == (ON_ClassId *)0x0) {
                            bVar3 = ON_UuidIsNil(&ud_header.m_appid);
                            if ((bVar3) ||
                               (iVar5 = (*this->_vptr_ON_BinaryArchive[9])
                                                  (this,ud_header.m_appid._0_8_,
                                                   ud_header.m_appid.Data4), iVar5 != 1)) {
                              this_00 = (ON_ClassId *)0x0;
                            }
                            else {
                              uuid_01.Data4[0] = in_stack_fffffffffffffeb8[0];
                              uuid_01.Data4[1] = in_stack_fffffffffffffeb8[1];
                              uuid_01.Data4[2] = in_stack_fffffffffffffeb8[2];
                              uuid_01.Data4[3] = in_stack_fffffffffffffeb8[3];
                              uuid_01.Data4[4] = in_stack_fffffffffffffeb8[4];
                              uuid_01.Data4[5] = in_stack_fffffffffffffeb8[5];
                              uuid_01.Data4[6] = in_stack_fffffffffffffeb8[6];
                              uuid_01.Data4[7] = in_stack_fffffffffffffeb8[7];
                              uuid_01.Data1 = 0x3ca6ec;
                              uuid_01.Data2 = 0;
                              uuid_01.Data3 = 0;
                              this_00 = ON_ClassId::ClassId(uuid_01);
                            }
                            if (this_00 == (ON_ClassId *)0x0) {
                              this_00 = &ON_UnknownUserData::m_ON_UnknownUserData_class_rtti;
                            }
                          }
                          p = ON_ClassId::Create(this_00);
                          this_01 = ON_UserData::Cast(p);
                          if (this_01 == (ON_UserData *)0x0) {
                            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                                       ,0x1610,"",
                                       "Reading object user data - unable to create userdata class")
                            ;
                            if (p != (ON_Object *)0x0) {
                              (*p->_vptr_ON_Object[4])(p);
                            }
                            bVar9 = 1;
                            bVar3 = false;
                            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                                       ,0x1620,"",
                                       "Unable to create object user data class. Flawed class id information."
                                      );
                            goto LAB_003ca37b;
                          }
                          uuid = &this_01->m_application_uuid;
                          bVar3 = ON_UuidIsNil(uuid);
                          if (bVar3) {
                            bVar3 = ON_UuidIsNil(&ud_header.m_appid);
                            if (bVar3) {
                              iVar5 = this->m_3dm_version;
                              if (iVar5 == 4) {
                                if (0xbf9a185 < this->m_3dm_opennurbs_version) goto LAB_003ca7e9;
                                pOVar6 = &ON_v4_userdata_id;
                              }
                              else if (iVar5 == 3) {
                                pOVar6 = &ON_v3_userdata_id;
                              }
                              else {
                                if (iVar5 != 2) goto LAB_003ca7e9;
                                pOVar6 = &ON_v2_userdata_id;
                              }
                              ud_header.m_appid.Data1 = pOVar6->Data1;
                              ud_header.m_appid.Data2 = pOVar6->Data2;
                              ud_header.m_appid.Data3 = pOVar6->Data3;
                              ud_header.m_appid.Data4 = *&pOVar6->Data4;
                            }
LAB_003ca7e9:
                            uuid->Data1 = ud_header.m_appid.Data1;
                            uuid->Data2 = ud_header.m_appid.Data2;
                            uuid->Data3 = ud_header.m_appid.Data3;
                            *&(this_01->m_application_uuid).Data4 = ud_header.m_appid.Data4;
                          }
                          (this_01->m_userdata_uuid).Data1 = ud_header.m_itemid.Data1;
                          (this_01->m_userdata_uuid).Data2 = ud_header.m_itemid.Data2;
                          (this_01->m_userdata_uuid).Data3 = ud_header.m_itemid.Data3;
                          *&(this_01->m_userdata_uuid).Data4 = ud_header.m_itemid.Data4;
                          this_01->m_userdata_copycount = ud_header.m_copycount;
                          pOVar10 = &ud_header.m_xform;
                          pOVar11 = &this_01->m_userdata_xform;
                          for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
                            pOVar11->m_xform[0][0] = pOVar10->m_xform[0][0];
                            pOVar10 = (ON_Xform *)((long)pOVar10 + (ulong)bVar12 * -0x10 + 8);
                            pOVar11 = (ON_Xform *)((long)pOVar11 + (ulong)bVar12 * -0x10 + 8);
                          }
                          bVar3 = ON_UserData::IsUnknownUserData(this_01);
                          if ((bVar3) &&
                             (pOVar7 = ON_UnknownUserData::Cast(&this_01->super_ON_Object),
                             pOVar7 != (ON_UnknownUserData *)0x0)) {
                            pOVar7->m_sizeof_buffer = (int)length_TCODE_ANONYMOUS_CHUNK;
                            (pOVar7->m_unknownclass_uuid).Data1 = ud_header.m_classid.Data1;
                            (pOVar7->m_unknownclass_uuid).Data2 = ud_header.m_classid.Data2;
                            (pOVar7->m_unknownclass_uuid).Data3 = ud_header.m_classid.Data3;
                            *&(pOVar7->m_unknownclass_uuid).Data4 = ud_header.m_classid.Data4;
                            pOVar7->m_3dm_version = ud_header.m_3dm_version;
                            pOVar7->m_3dm_opennurbs_version_number =
                                 ud_header.m_3dm_opennurbs_version_number;
                          }
                          this_01->m_userdata_owner = local_120;
                          bVar3 = ReadObjectUserDataAnonymousChunk
                                            (this,length_TCODE_ANONYMOUS_CHUNK,
                                             ud_header.m_3dm_version,
                                             ud_header.m_3dm_opennurbs_version_number,this_01);
                          this_01->m_userdata_owner = (ON_Object *)0x0;
                          pp_Var1 = (this_01->super_ON_Object)._vptr_ON_Object;
                          if (bVar3) {
                            iVar5 = (*pp_Var1[0x1c])(this_01,this,local_120);
                            if ((char)iVar5 == '\0') {
                              bVar3 = ON_Object::AttachUserData(local_120,this_01);
                              if (!bVar3) {
                                (*(this_01->super_ON_Object)._vptr_ON_Object[4])(this_01);
                              }
                            }
                            else {
                              (*(this_01->super_ON_Object)._vptr_ON_Object[4])(this_01);
                            }
                          }
                          else {
                            (*pp_Var1[4])(this_01);
                          }
                        }
                        else {
                          ch.m_bSupressPartiallyReadChunkWarning = true;
                        }
                        bVar9 = 1;
                        bVar3 = false;
                        goto LAB_003ca37b;
                      }
                    }
                    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                               ,iVar5,"",sFormat);
                  }
                  bVar3 = true;
                  bVar9 = 0;
                  goto LAB_003ca37b;
                }
                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                           ,0x1562,"","Unable to read user data header information.");
              }
              bVar3 = true;
              bVar9 = 0;
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                         ,0x15cb,"","Unable to read user data header information.");
            }
            else {
              bVar3 = true;
              bVar9 = 0;
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                         ,0x15bd,"",
                         "Unable to read TCODE_OPENNURBS_CLASS_USERDATA chunk version numbers");
            }
          }
        }
        else {
          if (ch.m_chunk_tcode == 0) goto LAB_003ca379;
LAB_003ca3fc:
          bVar3 = false;
        }
      }
    }
    else {
LAB_003ca379:
      bVar9 = 0;
    }
LAB_003ca37b:
    ON_ReadChunkHelper::~ON_ReadChunkHelper(&ch);
  } while (!bVar3);
  return (bool)(bVar9 & bChunkReadSuccess);
}

Assistant:

bool ON_BinaryArchive::ReadObjectUserData( ON_Object& object )
{
  bool rc = true;
  bool bChunkReadSuccess = true;
  while(rc && bChunkReadSuccess) 
  {
    // Note:
    //  The destructor ~ON_ReadChunkHelper() may set bChunkReadSuccess
    //  An example of this case occures when reading the corrupt file
    //  attached to bug report RH-22547.
    ON_ReadChunkHelper ch(*this,bChunkReadSuccess);
    if ( !bChunkReadSuccess )
    {
      rc = false;
      break;
    }

    if ( TCODE_OPENNURBS_CLASS_END == ch.m_chunk_tcode )
    {
      // A short TCODE_OPENNURBS_CLASS_END chunk marks the end of the opennurbs class
      break; // done
    }

    if ( TCODE_OPENNURBS_CLASS_USERDATA != ch.m_chunk_tcode )
    {
      if ( 0 == ch.m_chunk_tcode )
      {
        // A short TCODE_OPENNURBS_CLASS_END chunk marks the end of the opennurbs class
        // Checking for zero here fixes RH-22547 which was a report of Rescue3dm taking
        // hours to read a damaged file that was filled with large blocks of zeros 
        // caused by some form of storage media or tranmission corruption.
        rc = false; // there should never be a typecode of zero.
        break;
      }

      // skip new chunk type added by later version
      continue;
    }

    if ( ch.m_chunk_value < (ON__INT64)(8 + 4 * SizeofChunkLength()) )
    {
      ON_ERROR("TCODE_OPENNURBS_CLASS_USERDATA chunk is too short");
      continue;
    }

    // Read userdata header information
    int major_userdata_version = 0;
    int minor_userdata_version = 0;
    rc = Read3dmChunkVersion( &major_userdata_version, &minor_userdata_version );
    if ( !rc )
    {
      ON_ERROR("Unable to read TCODE_OPENNURBS_CLASS_USERDATA chunk version numbers");
      break;
    }

    if ( major_userdata_version < 1 || major_userdata_version > 2 )
    {
      // unsupported version - too old or added in new version
      continue;
    }

    CUserDataHeaderInfo ud_header;
    rc = ReadObjectUserDataHeaderHelper(*this,major_userdata_version,minor_userdata_version,ud_header);
    if (!rc)
    {
      ON_ERROR("Unable to read user data header information.");
      break;
    }

    // we should be ready to read a TCODE_ANONYMOUS_CHUNK containing userdata
    ON__INT64 length_TCODE_ANONYMOUS_CHUNK = 0;
    for(;;)
    {
      ON__UINT32 t = 0;
      rc = PeekAt3dmBigChunkType( &t, &length_TCODE_ANONYMOUS_CHUNK );
      if (!rc)
        break;
      if ( t != TCODE_ANONYMOUS_CHUNK )
      {
        ON_ERROR("Reading object user data - unable to find TCODE_ANONYMOUS_CHUNK");
        rc = false;
        break;
      }
      if ( length_TCODE_ANONYMOUS_CHUNK < 4 )
      {
        ON_ERROR("Reading object user data - length of TCODE_ANONYMOUS_CHUNK < 4");
        rc = false;
        break;
      }
      break;
    }
    if (!rc)
    {
      break;
    }

    if (false == ShouldSerializeUserDataItem(ud_header.m_appid, ud_header.m_itemid))
    {
      ch.m_bSupressPartiallyReadChunkWarning = true;
      continue;
    }

    // attempt to get an instance of the userdata class that saved this information
    ON_UserData* ud = 0;
    for(;;)
    {
      const ON_ClassId* udId = ON_ClassId::ClassId( ud_header.m_classid );
      if ( 0 == udId ) 
      {
        // The application that created this userdata is not active
        if ( !ON_UuidIsNil(ud_header.m_appid) )
        {
          // see if we can load the application
          if ( 1 == LoadUserDataApplication(ud_header.m_appid) )
          {
            // try again
            udId = ON_ClassId::ClassId( ud_header.m_classid );
          }
        }

        if ( 0 == udId )
        {
          // The application that created this user data is
          // not available.  This information will be stored
          // in an ON_UnknownUserData class so that it can
          // persist.
          udId = &ON_CLASS_RTTI(ON_UnknownUserData);
        }
      }

      ON_Object* tmp = udId->Create();
      ud = ON_UserData::Cast(tmp);
      if ( 0 == ud )
      {
        ON_ERROR("Reading object user data - unable to create userdata class");
        if ( tmp )
          delete tmp;
        tmp = 0;
        break;
      }
      tmp = 0;

      break;
    }

    if ( 0 == ud )
    {
      // no luck on this one 
      // One reason can be that the plug-in userdata class has something wrong with 
      // its ON_OBJECT_DECLARE/ON_OBJECT_IMPLEMENT stuff.
      ON_ERROR("Unable to create object user data class. Flawed class id information.");
      continue; // keep trying
    }

    if ( ON_UuidIsNil(ud->m_application_uuid) )
    {
      if ( ON_UuidIsNil(ud_header.m_appid) )
      {
        switch( Archive3dmVersion())
        {
        case 2:
          // V2 archives do not contain app ids.
          // This id flags the userdata as being read from a V3 archive.
          ud_header.m_appid = ON_v2_userdata_id;
          break;
        case 3:
          // V3 archives do not contain app ids.
          // This id flags the userdata as being
          // read from a V3 archive.
          ud_header.m_appid = ON_v3_userdata_id;
          break;
        case 4:
          if ( ArchiveOpenNURBSVersion() < 200909190 )
          {
            // V4 archives before version 200909190
            // did not require user data application ids.
            ud_header.m_appid = ON_v4_userdata_id;
          }
          break;
        }
      }
      ud->m_application_uuid = ud_header.m_appid;
    }
    ud->m_userdata_uuid = ud_header.m_itemid;
    ud->m_userdata_copycount = ud_header.m_copycount;
    ud->m_userdata_xform = ud_header.m_xform;
    if ( ud->IsUnknownUserData() ) 
    {
      ON_UnknownUserData* uud = ON_UnknownUserData::Cast(ud);
      if ( uud ) 
      {
        uud->m_sizeof_buffer = (int)length_TCODE_ANONYMOUS_CHUNK;
        uud->m_unknownclass_uuid = ud_header.m_classid;
        uud->m_3dm_version = ud_header.m_3dm_version;
        uud->m_3dm_opennurbs_version_number = ud_header.m_3dm_opennurbs_version_number;
      }
    }
    ud->m_userdata_owner = &object; // so reading code can look at owner
    bool bReadUserData = ReadObjectUserDataAnonymousChunk(
              length_TCODE_ANONYMOUS_CHUNK,
              ud_header.m_3dm_version,
              ud_header.m_3dm_opennurbs_version_number,
              ud
              );
    ud->m_userdata_owner = 0;
    if (bReadUserData)
    {
      if (ud->DeleteAfterRead(*this,&object))
      {
        // obsolete user data
        delete ud;
      }
      else if (!object.AttachUserData(ud))
      {
        // attach failed
        delete ud;
      }
    }
    else
    {
      delete ud;
    }    
  }

  if ( !bChunkReadSuccess )
    rc = false;

  return rc;
}